

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

void __thiscall libtorrent::settings_pack::set_str(settings_pack *this,int name,string *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  const_iterator __position;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if ((name & 0xc000U) == 0) {
    local_48._0_2_ = (undefined2)name;
    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(val->_M_dataplus)._M_p;
    paVar1 = &val->field_2;
    if (local_68 == paVar1) {
      local_58._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_58._8_8_ = *(undefined8 *)((long)&val->field_2 + 8);
      local_68 = &local_58;
    }
    else {
      local_58._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_38 = val->_M_string_length;
    (val->_M_dataplus)._M_p = (pointer)paVar1;
    val->_M_string_length = 0;
    (val->field_2)._M_local_buf[0] = '\0';
    if (local_68 == &local_58) {
      local_30._8_8_ = local_58._8_8_;
      local_40._M_p = (pointer)&local_30;
    }
    else {
      local_40._M_p = (pointer)local_68;
    }
    local_30._M_allocated_capacity = local_58._M_allocated_capacity;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    __position._M_current =
         (this->m_strings).
         super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)ppVar2 - (long)__position._M_current;
    if (0 < (long)uVar3) {
      uVar3 = (uVar3 >> 3) * -0x3333333333333333;
      do {
        uVar4 = uVar3 >> 1;
        uVar5 = uVar4;
        if (__position._M_current[uVar4].first < (ushort)local_48._0_2_) {
          uVar5 = ~uVar4 + uVar3;
          __position._M_current = __position._M_current + uVar4 + 1;
        }
        uVar3 = uVar5;
      } while (0 < (long)uVar5);
    }
    if ((__position._M_current == ppVar2) || ((__position._M_current)->first != local_48._0_2_)) {
      ::std::
      vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_insert_rval(&this->m_strings,__position,(value_type *)local_48);
    }
    else {
      ::std::__cxx11::string::operator=
                ((string *)&(__position._M_current)->second,(string *)&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void settings_pack::set_str(int const name, std::string val)
	{
		TORRENT_ASSERT((name & type_mask) == string_type_base);
		if ((name & type_mask) != string_type_base) return;
		std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::move(val));
		insort_replace(m_strings, std::move(v));
	}